

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O3

int io_close(lua_State *L)

{
  code *UNRECOVERED_JUMPTABLE;
  int iVar1;
  void *pvVar2;
  lua_CFunction cf;
  
  iVar1 = lua_type(L,1);
  if (iVar1 == -1) {
    lua_getfield(L,-0xf4628,"_IO_output");
  }
  tofile(L);
  pvVar2 = luaL_checkudata(L,1,"FILE*");
  UNRECOVERED_JUMPTABLE = *(code **)((long)pvVar2 + 8);
  *(undefined8 *)((long)pvVar2 + 8) = 0;
  iVar1 = (*UNRECOVERED_JUMPTABLE)(L);
  return iVar1;
}

Assistant:

static int io_close(lua_State *L) {
    if (lua_isnone(L, 1))  /* no argument? */
        lua_getfield(L, LUA_REGISTRYINDEX, IO_OUTPUT);  /* use standard output */
    tofile(L);  /* make sure argument is an open stream */
    return aux_close(L);
}